

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

char * phosg::getcwd_abi_cxx11_(char *__buf,size_t __size)

{
  char *pcVar1;
  size_t __n;
  runtime_error *this;
  
  *(char **)__buf = __buf + 0x10;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,0x1000,'\0')
  ;
  pcVar1 = ::getcwd(*(char **)__buf,*(size_t *)(__buf + 8));
  if (pcVar1 != (char *)0x0) {
    __n = strlen(*(char **)__buf);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf,__n,'\0');
    return __buf;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"cannot get working directory");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string getcwd() {
  string ret(MAXPATHLEN, '\0');
  if (!::getcwd(ret.data(), ret.size())) {
    throw runtime_error("cannot get working directory");
  }
  ret.resize(strlen(ret.c_str()));
  return ret;
}